

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O2

void __thiscall VcdGen::VcdGenerator::generate_module_info(VcdGenerator *this,Module *module)

{
  Signal *pSVar1;
  pointer ppMVar2;
  VcdGenerator *this_00;
  pointer ppSVar3;
  pointer ppMVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pointer local_58;
  pointer local_50;
  VcdGenerator *local_48;
  Module *local_40;
  string *local_38;
  
  std::__cxx11::string::string((string *)&local_78,(string *)module);
  std::operator+(&local_98,"$scope module ",&local_78);
  std::operator+(&local_b8,&local_98," $end\n");
  local_38 = (string *)&this->vcd_data_;
  local_48 = this;
  std::__cxx11::string::append(local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_50 = (module->signals_).
             super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppSVar3 = (module->signals_).
            super__Vector_base<VcdGen::Signal_*,_std::allocator<VcdGen::Signal_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = module;
  while (this_00 = local_48, ppSVar3 != local_50) {
    pSVar1 = *ppSVar3;
    local_58 = ppSVar3;
    std::__cxx11::to_string(&local_118,pSVar1->width_);
    std::operator+(&local_178,"$var wire ",&local_118);
    std::operator+(&local_d8,&local_178," ");
    std::__cxx11::string::string((string *)&local_f8,(string *)&pSVar1->encoded_name_);
    std::operator+(&local_138,&local_d8,&local_f8);
    std::operator+(&local_78,&local_138," ");
    std::__cxx11::string::string((string *)&local_158,(string *)pSVar1);
    std::operator+(&local_98,&local_78,&local_158);
    std::operator+(&local_b8,&local_98," $end\n");
    std::__cxx11::string::append(local_38);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_118);
    ppSVar3 = local_58 + 1;
  }
  ppMVar2 = (local_40->sub_modules_).
            super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar4 = (local_40->sub_modules_).
                 super__Vector_base<VcdGen::Module_*,_std::allocator<VcdGen::Module_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar4 != ppMVar2; ppMVar4 = ppMVar4 + 1) {
    generate_module_info(this_00,*ppMVar4);
  }
  std::__cxx11::string::append((char *)local_38);
  return;
}

Assistant:

void generate_module_info(Module* module){
        vcd_data_ += "$scope module " + module->get_name() + " $end\n";
        for( auto signal : module->get_signals() ){
            vcd_data_ += "$var wire " + to_string(signal->get_width()) + " " + 
                         signal->get_encoded_name() + " " + signal->get_name() + 
                         " $end\n";
        }

        //if( module->get_num_submodules() > 0){
        //    vector<Module*> &sub_mods = module->get_submodules();
        //    Module* m = sub_mods[0];
        //    sub_mods.erase(sub_mods.begin());
        //    generate_module_info(m);
        //}

        for( auto m : module->get_submodules() ){
            generate_module_info(m);
        } 
        
        vcd_data_ += "$upscope $end\n";
    }